

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O0

bool __thiscall branch_and_reduce_algorithm::fold2Reduction(branch_and_reduce_algorithm *this)

{
  uint uVar1;
  int iVar2;
  initializer_list<int> __l;
  FILE *__stream;
  bool bVar3;
  vector<int,_std::allocator<int>_> *this_00;
  reference pvVar4;
  reference pvVar5;
  reference piVar6;
  undefined8 uVar7;
  int iVar8;
  string local_100;
  allocator<int> local_dd;
  int local_dc;
  iterator local_d8;
  size_type local_d0;
  vector<int,_std::allocator<int>_> local_c8;
  allocator<int> local_99;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  undefined1 local_80 [8];
  vector<int,_std::allocator<int>_> copyOfTmp;
  iterator iStack_60;
  int u_1;
  iterator __end3_1;
  iterator __begin3_1;
  value_type *__range3_1;
  iterator iStack_40;
  int u;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  int p;
  int v;
  vector<int,_std::allocator<int>_> *tmp;
  int oldn;
  branch_and_reduce_algorithm *this_local;
  
  uVar1 = this->rn;
  this_00 = &this->level;
  __range3._4_4_ = 0;
  do {
    __stream = _stderr;
    if (this->n <= __range3._4_4_) {
      if (((2 < debug) && (this->depth <= this->maxDepth)) && (uVar1 != this->rn)) {
        debugString_abi_cxx11_(&local_100,this);
        uVar7 = std::__cxx11::string::c_str();
        fprintf(__stream,"%sfold2: %d -> %d\n",uVar7,(ulong)uVar1,(ulong)(uint)this->rn);
        std::__cxx11::string::~string((string *)&local_100);
      }
      return uVar1 != this->rn;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)__range3._4_4_);
    if (*pvVar4 < 0) {
      __range3._0_4_ = 0;
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->adj,(long)__range3._4_4_);
      __end3 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
      iStack_40 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
      while (bVar3 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffffc0), bVar3) {
        piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end3);
        iVar2 = *piVar6;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar2);
        if (*pvVar4 < 0) {
          iVar8 = (int)__range3 + 1;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)(int)__range3);
          *pvVar4 = iVar2;
          __range3._0_4_ = iVar8;
          if (2 < iVar8) goto LAB_001190ce;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3);
      }
      if (1 < (int)__range3) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0);
        pvVar5 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->adj,(long)*pvVar4);
        __end3_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
        iStack_60 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
        while (bVar3 = __gnu_cxx::operator!=(&__end3_1,&stack0xffffffffffffffa0), bVar3) {
          piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end3_1);
          iVar2 = *piVar6;
          copyOfTmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ = iVar2;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_00,1);
          if (iVar2 == *pvVar4) {
            set(this,__range3._4_4_,0);
            goto LAB_001190ce;
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end3_1);
        }
        local_88._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this_00);
        local_98._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this_00);
        local_90 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator+(&local_98,2);
        std::allocator<int>::allocator(&local_99);
        std::vector<int,std::allocator<int>>::
        vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,std::allocator<int>> *)local_80,local_88,local_90,&local_99);
        std::allocator<int>::~allocator(&local_99);
        local_dc = __range3._4_4_;
        local_d8 = &local_dc;
        local_d0 = 1;
        std::allocator<int>::allocator(&local_dd);
        __l._M_len = local_d0;
        __l._M_array = local_d8;
        std::vector<int,_std::allocator<int>_>::vector(&local_c8,__l,&local_dd);
        compute_fold(this,&local_c8,(vector<int,_std::allocator<int>_> *)local_80);
        std::vector<int,_std::allocator<int>_>::~vector(&local_c8);
        std::allocator<int>::~allocator(&local_dd);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_80);
      }
    }
LAB_001190ce:
    __range3._4_4_ = __range3._4_4_ + 1;
  } while( true );
}

Assistant:

bool branch_and_reduce_algorithm::fold2Reduction()
{
    int oldn = rn;
    std::vector<int> &tmp = level;
    for (int v = 0; v < n; v++)
        if (x[v] < 0)
        {
            int p = 0;
            for (int u : adj[v])
                if (x[u] < 0)
                {
                    tmp[p++] = u;
                    if (p > 2)
                        goto loop;
                }
            if (p < 2)
                continue;
            for (int u : adj[tmp[0]])
                if (u == tmp[1]) // triangle
                {
                    set(v, 0);
                    goto loop;
                }
            {
                std::vector<int> copyOfTmp(tmp.begin(), tmp.begin() + 2);
                compute_fold(std::vector<int>{v}, copyOfTmp);
            }
        loop:;
        }
    if (debug >= 3 && depth <= maxDepth && oldn != rn)
        fprintf(stderr, "%sfold2: %d -> %d\n", debugString().c_str(), oldn, rn);
    return oldn != rn;
}